

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_swift_generator.cc
# Opt level: O0

void __thiscall
t_swift_generator::render_const_value
          (t_swift_generator *this,ostream *out,t_type *type,t_const_value *value)

{
  t_type *ptVar1;
  __type _Var2;
  bool bVar3;
  uint uVar4;
  t_const_value_type tVar5;
  int64_t iVar6;
  ulong uVar7;
  ostream *poVar8;
  reference pptVar9;
  string *psVar10;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> *__lhs;
  t_type *ptVar11;
  t_type *ptVar12;
  pointer ppVar13;
  _Self *p_Var14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar16;
  char *pcVar17;
  double dVar18;
  undefined1 auVar19 [12];
  _Self local_2a8;
  _Self local_2a0;
  _Base_ptr local_298;
  _Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_> local_290;
  const_iterator v_iter_3;
  map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
  *val_3;
  t_type *etype_1;
  _Self local_270;
  _Base_ptr local_268;
  _Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_> local_260;
  const_iterator v_iter_2;
  map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
  *val_2;
  t_type *etype;
  _Self local_240;
  _Base_ptr local_238;
  _Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_> local_230;
  const_iterator v_iter_1;
  map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
  *val_1;
  t_type *vtype;
  t_type *ktype;
  undefined1 local_201;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  string local_1a0;
  _Self local_180;
  _Base_ptr local_178;
  t_const_value *local_170;
  t_const_value *value_1;
  t_field *tfield;
  t_field **local_158;
  _Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_> local_150;
  const_iterator v_iter;
  map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
  *val;
  const_iterator f_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *fields;
  byte local_109;
  string local_108;
  string local_e8;
  undefined1 local_c1;
  string local_c0;
  string local_a0;
  string local_80;
  string local_50;
  t_base local_2c;
  t_const_value *ptStack_28;
  t_base tbase;
  t_const_value *value_local;
  t_type *type_local;
  ostream *out_local;
  t_swift_generator *this_local;
  
  ptStack_28 = value;
  value_local = (t_const_value *)type;
  type_local = (t_type *)out;
  out_local = (ostream *)this;
  value_local = (t_const_value *)t_generator::get_true_type(type);
  uVar4 = (*((t_doc *)&value_local->mapVal_)->_vptr_t_doc[5])();
  if ((uVar4 & 1) == 0) {
    uVar7 = (**(code **)(*(long *)&(value_local->mapVal_)._M_t._M_impl + 0x50))();
    ptVar12 = type_local;
    if ((uVar7 & 1) == 0) {
      uVar7 = (**(code **)(*(long *)&(value_local->mapVal_)._M_t._M_impl + 0x58))();
      if (((uVar7 & 1) == 0) &&
         (uVar7 = (**(code **)(*(long *)&(value_local->mapVal_)._M_t._M_impl + 0x60))(),
         (uVar7 & 1) == 0)) {
        uVar7 = (**(code **)(*(long *)&(value_local->mapVal_)._M_t._M_impl + 0x80))();
        if ((uVar7 & 1) == 0) {
          uVar7 = (**(code **)(*(long *)&(value_local->mapVal_)._M_t._M_impl + 0x70))();
          if ((uVar7 & 1) == 0) {
            uVar7 = (**(code **)(*(long *)&(value_local->mapVal_)._M_t._M_impl + 0x78))();
            if ((uVar7 & 1) == 0) {
              pbVar15 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        __cxa_allocate_exception(0x20);
              pbVar16 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (**(code **)(*(long *)&(value_local->mapVal_)._M_t._M_impl + 0x18))();
              std::operator+(pbVar15,"compiler error: no const of type ",pbVar16);
              __cxa_throw(pbVar15,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
            }
            std::operator<<((ostream *)type_local,"[");
            ptVar12 = t_set::get_elem_type((t_set *)value_local);
            v_iter_3._M_node = (_Base_ptr)t_const_value::get_map(ptStack_28);
            std::_Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>::
            _Rb_tree_const_iterator(&local_290);
            local_298 = (_Base_ptr)
                        std::
                        map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                        ::begin(v_iter_3._M_node);
            local_290._M_node = local_298;
            while( true ) {
              local_2a0._M_node =
                   (_Base_ptr)
                   std::
                   map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                   ::end(v_iter_3._M_node);
              bVar3 = std::operator!=(&local_290,&local_2a0);
              ptVar11 = type_local;
              if (!bVar3) break;
              ppVar13 = std::
                        _Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>::
                        operator->(&local_290);
              render_const_value(this,(ostream *)ptVar11,ptVar12,ppVar13->first);
              p_Var14 = std::
                        _Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>::
                        operator++(&local_290);
              local_2a8._M_node =
                   (_Base_ptr)
                   std::
                   map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                   ::end(v_iter_3._M_node);
              bVar3 = std::operator!=(p_Var14,&local_2a8);
              if (bVar3) {
                std::operator<<((ostream *)type_local,", ");
              }
            }
            std::operator<<((ostream *)type_local,"]");
          }
          else {
            std::operator<<((ostream *)type_local,"[");
            ptVar12 = t_list::get_elem_type((t_list *)value_local);
            v_iter_2._M_node = (_Base_ptr)t_const_value::get_map(ptStack_28);
            std::_Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>::
            _Rb_tree_const_iterator(&local_260);
            local_268 = (_Base_ptr)
                        std::
                        map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                        ::begin(v_iter_2._M_node);
            local_260._M_node = local_268;
            while( true ) {
              local_270._M_node =
                   (_Base_ptr)
                   std::
                   map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                   ::end(v_iter_2._M_node);
              bVar3 = std::operator!=(&local_260,&local_270);
              ptVar11 = type_local;
              if (!bVar3) break;
              ppVar13 = std::
                        _Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>::
                        operator->(&local_260);
              render_const_value(this,(ostream *)ptVar11,ptVar12,ppVar13->first);
              p_Var14 = std::
                        _Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>::
                        operator++(&local_260);
              etype_1 = (t_type *)
                        std::
                        map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                        ::end((map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                               *)v_iter_2._M_node);
              bVar3 = std::operator!=(p_Var14,(_Self *)&etype_1);
              if (bVar3) {
                std::operator<<((ostream *)type_local,", ");
              }
            }
            std::operator<<((ostream *)type_local,"]");
          }
        }
        else {
          std::operator<<((ostream *)type_local,"[");
          ptVar12 = t_map::get_key_type((t_map *)value_local);
          ptVar11 = t_map::get_val_type((t_map *)value_local);
          v_iter_1._M_node = (_Base_ptr)t_const_value::get_map(ptStack_28);
          std::_Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>::
          _Rb_tree_const_iterator(&local_230);
          local_238 = (_Base_ptr)
                      std::
                      map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                      ::begin(v_iter_1._M_node);
          local_230._M_node = local_238;
          while( true ) {
            local_240._M_node =
                 (_Base_ptr)
                 std::
                 map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                 ::end(v_iter_1._M_node);
            bVar3 = std::operator!=(&local_230,&local_240);
            ptVar1 = type_local;
            if (!bVar3) break;
            ppVar13 = std::
                      _Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>::
                      operator->(&local_230);
            render_const_value(this,(ostream *)ptVar1,ptVar12,ppVar13->first);
            std::operator<<((ostream *)type_local,": ");
            ptVar1 = type_local;
            ppVar13 = std::
                      _Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>::
                      operator->(&local_230);
            render_const_value(this,(ostream *)ptVar1,ptVar11,ppVar13->second);
            p_Var14 = std::
                      _Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>::
                      operator++(&local_230);
            etype = (t_type *)
                    std::
                    map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                    ::end((map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                           *)v_iter_1._M_node);
            bVar3 = std::operator!=(p_Var14,(_Self *)&etype);
            if (bVar3) {
              std::operator<<((ostream *)type_local,", ");
            }
          }
          std::operator<<((ostream *)type_local,"]");
        }
      }
      else {
        ptVar12 = type_local;
        type_name_abi_cxx11_((string *)&fields,this,(t_type *)value_local,false,false);
        poVar8 = std::operator<<((ostream *)ptVar12,(string *)&fields);
        std::operator<<(poVar8,"(");
        std::__cxx11::string::~string((string *)&fields);
        f_iter._M_current = (t_field **)t_struct::get_members((t_struct *)value_local);
        __gnu_cxx::
        __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
        __normal_iterator((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                           *)&val);
        v_iter._M_node = (_Base_ptr)t_const_value::get_map(ptStack_28);
        std::_Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>::
        _Rb_tree_const_iterator(&local_150);
        local_158 = (t_field **)
                    std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(f_iter._M_current);
        val = (map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
               *)local_158;
        while( true ) {
          tfield = (t_field *)
                   std::vector<t_field_*,_std::allocator<t_field_*>_>::end
                             ((vector<t_field_*,_std::allocator<t_field_*>_> *)f_iter._M_current);
          bVar3 = __gnu_cxx::operator!=
                            ((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                              *)&val,(__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                                      *)&tfield);
          if (!bVar3) break;
          pptVar9 = __gnu_cxx::
                    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                    ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                                 *)&val);
          value_1 = (t_const_value *)*pptVar9;
          local_170 = (t_const_value *)0x0;
          local_178 = (_Base_ptr)
                      std::
                      map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                      ::begin(v_iter._M_node);
          local_150._M_node = local_178;
          while( true ) {
            local_180._M_node =
                 (_Base_ptr)
                 std::
                 map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                 ::end(v_iter._M_node);
            bVar3 = std::operator!=(&local_150,&local_180);
            ptVar12 = type_local;
            if (!bVar3) break;
            psVar10 = t_field::get_name_abi_cxx11_((t_field *)value_1);
            ppVar13 = std::
                      _Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>::
                      operator->(&local_150);
            t_const_value::get_string_abi_cxx11_(&local_1a0,ppVar13->first);
            _Var2 = std::operator==(psVar10,&local_1a0);
            std::__cxx11::string::~string((string *)&local_1a0);
            if (_Var2) {
              ppVar13 = std::
                        _Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>::
                        operator->(&local_150);
              local_170 = ppVar13->second;
            }
            std::_Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>::
            operator++(&local_150);
          }
          if (local_170 == (t_const_value *)0x0) {
            bVar3 = field_is_optional(this,(t_field *)value_1);
            if (!bVar3) {
              local_201 = 1;
              pbVar15 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        __cxa_allocate_exception(0x20);
              pbVar16 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (**(code **)(*(long *)&(value_local->mapVal_)._M_t._M_impl + 0x18))();
              std::operator+(&local_200,"constant error: required field ",pbVar16);
              std::operator+(&local_1e0,&local_200,".");
              psVar10 = t_field::get_name_abi_cxx11_((t_field *)value_1);
              std::operator+(&local_1c0,&local_1e0,psVar10);
              std::operator+(pbVar15,&local_1c0," has no value");
              local_201 = 0;
              __cxa_throw(pbVar15,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
            }
          }
          else {
            psVar10 = t_field::get_name_abi_cxx11_((t_field *)value_1);
            poVar8 = std::operator<<((ostream *)ptVar12,(string *)psVar10);
            std::operator<<(poVar8,": ");
            ptVar12 = type_local;
            ptVar11 = t_field::get_type((t_field *)value_1);
            render_const_value(this,(ostream *)ptVar12,ptVar11,local_170);
          }
          __lhs = __gnu_cxx::
                  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  ::operator++((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                                *)&val);
          ktype = (t_type *)
                  std::vector<t_field_*,_std::allocator<t_field_*>_>::end
                            ((vector<t_field_*,_std::allocator<t_field_*>_> *)f_iter._M_current);
          bVar3 = __gnu_cxx::operator!=
                            (__lhs,(__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                                    *)&ktype);
          if (bVar3) {
            std::operator<<((ostream *)type_local,", ");
          }
        }
        std::operator<<((ostream *)type_local,")");
      }
    }
    else {
      local_109 = 0;
      if ((this->gen_cocoa_ & 1U) == 0) {
        t_const_value::get_identifier_abi_cxx11_(&local_108,ptStack_28);
        local_109 = 1;
        enum_const_name(&local_e8,this,&local_108);
      }
      else {
        t_const_value::get_identifier_abi_cxx11_(&local_e8,ptStack_28);
      }
      std::operator<<((ostream *)ptVar12,(string *)&local_e8);
      std::__cxx11::string::~string((string *)&local_e8);
      if ((local_109 & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_108);
      }
    }
  }
  else {
    local_2c = t_base_type::get_base((t_base_type *)value_local);
    ptVar12 = type_local;
    switch(local_2c) {
    case TYPE_STRING:
      poVar8 = std::operator<<((ostream *)type_local,"\"");
      t_generator::get_escaped_string_abi_cxx11_(&local_50,(t_generator *)this,ptStack_28);
      poVar8 = std::operator<<(poVar8,(string *)&local_50);
      std::operator<<(poVar8,"\"");
      std::__cxx11::string::~string((string *)&local_50);
      break;
    case TYPE_BOOL:
      iVar6 = t_const_value::get_integer(ptStack_28);
      pcVar17 = "false";
      if (0 < iVar6) {
        pcVar17 = "true";
      }
      std::operator<<((ostream *)ptVar12,pcVar17);
      break;
    case TYPE_I8:
    case TYPE_I16:
    case TYPE_I32:
    case TYPE_I64:
      type_name_abi_cxx11_(&local_80,this,(t_type *)value_local,false,false);
      poVar8 = std::operator<<((ostream *)ptVar12,(string *)&local_80);
      poVar8 = std::operator<<(poVar8,"(");
      iVar6 = t_const_value::get_integer(ptStack_28);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar6);
      std::operator<<(poVar8,")");
      std::__cxx11::string::~string((string *)&local_80);
      break;
    case TYPE_DOUBLE:
      type_name_abi_cxx11_(&local_a0,this,(t_type *)value_local,false,false);
      poVar8 = std::operator<<((ostream *)ptVar12,(string *)&local_a0);
      std::operator<<(poVar8,"(");
      std::__cxx11::string::~string((string *)&local_a0);
      tVar5 = t_const_value::get_type(ptStack_28);
      ptVar12 = type_local;
      if (tVar5 == CV_INTEGER) {
        iVar6 = t_const_value::get_integer(ptStack_28);
        std::ostream::operator<<(ptVar12,iVar6);
      }
      else {
        dVar18 = t_const_value::get_double(ptStack_28);
        std::ostream::operator<<(ptVar12,dVar18);
      }
      std::operator<<((ostream *)type_local,")");
      break;
    default:
      local_c1 = 1;
      auVar19 = __cxa_allocate_exception(0x20);
      t_base_type::t_base_name_abi_cxx11_(&local_c0,(t_base_type *)(ulong)local_2c,auVar19._8_4_);
      std::operator+(auVar19._0_8_,"compiler error: no const of base type ",&local_c0);
      local_c1 = 0;
      __cxa_throw(auVar19._0_8_,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
    }
  }
  return;
}

Assistant:

void t_swift_generator::render_const_value(ostream& out,
                                           t_type* type,
                                           t_const_value* value) {
  type = get_true_type(type);

  if (type->is_base_type()) {
    t_base_type::t_base tbase = ((t_base_type*)type)->get_base();
    switch (tbase) {
    case t_base_type::TYPE_STRING:
      out << "\"" << get_escaped_string(value) << "\"";
      break;
    case t_base_type::TYPE_BOOL:
      out << ((value->get_integer() > 0) ? "true" : "false");
      break;
    case t_base_type::TYPE_I8:
    case t_base_type::TYPE_I16:
    case t_base_type::TYPE_I32:
    case t_base_type::TYPE_I64:
      out << type_name(type) << "(" << value->get_integer() << ")";
      break;
    case t_base_type::TYPE_DOUBLE:
      out << type_name(type) << "(";
      if (value->get_type() == t_const_value::CV_INTEGER) {
        out << value->get_integer();
      } else {
        out << value->get_double();
      }
      out << ")";
      break;
    default:
      throw "compiler error: no const of base type " + t_base_type::t_base_name(tbase);
    }
  } else if (type->is_enum()) {
    out << (gen_cocoa_ ? value->get_identifier() : enum_const_name(value->get_identifier())); // Swift2/Cocoa compatibility
  } else if (type->is_struct() || type->is_xception()) {

    out << type_name(type) << "(";

    const vector<t_field*>& fields = ((t_struct*)type)->get_members();
    vector<t_field*>::const_iterator f_iter;

    const map<t_const_value*, t_const_value*, t_const_value::value_compare>& val = value->get_map();
    map<t_const_value*, t_const_value*, t_const_value::value_compare>::const_iterator v_iter;

    for (f_iter = fields.begin(); f_iter != fields.end();) {
      t_field* tfield = *f_iter;
      t_const_value* value = nullptr;
      for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
        if (tfield->get_name() == v_iter->first->get_string()) {
          value = v_iter->second;
        }
      }

      if (value) {
        out << tfield->get_name() << ": ";
        render_const_value(out, tfield->get_type(), value);
      }
      else if (!field_is_optional(tfield)) {
        throw "constant error: required field " + type->get_name() + "." + tfield->get_name() + " has no value";
      }

      if (++f_iter != fields.end()) {
        out << ", ";
      }
    }

    out << ")";

  } else if (type->is_map()) {

    out << "[";

    t_type* ktype = ((t_map*)type)->get_key_type();
    t_type* vtype = ((t_map*)type)->get_val_type();

    const map<t_const_value*, t_const_value*, t_const_value::value_compare>& val = value->get_map();
    map<t_const_value*, t_const_value*, t_const_value::value_compare>::const_iterator v_iter;

    for (v_iter = val.begin(); v_iter != val.end();) {

      render_const_value(out, ktype, v_iter->first);
      out << ": ";
      render_const_value(out, vtype, v_iter->second);

      if (++v_iter != val.end()) {
        out << ", ";
      }
    }

    out << "]";

  } else if (type->is_list()) {

    out << "[";

    t_type* etype = ((t_list*)type)->get_elem_type();

    const map<t_const_value*, t_const_value*, t_const_value::value_compare>& val = value->get_map();
    map<t_const_value*, t_const_value*, t_const_value::value_compare>::const_iterator v_iter;

    for (v_iter = val.begin(); v_iter != val.end();) {

      render_const_value(out, etype, v_iter->first);

      if (++v_iter != val.end()) {
        out << ", ";
      }
    }

    out << "]";

  } else if (type->is_set()) {

    out << "[";

    t_type* etype = ((t_set*)type)->get_elem_type();

    const map<t_const_value*, t_const_value*, t_const_value::value_compare>& val = value->get_map();
    map<t_const_value*, t_const_value*, t_const_value::value_compare>::const_iterator v_iter;

    for (v_iter = val.begin(); v_iter != val.end();) {

      render_const_value(out, etype, v_iter->first);

      if (++v_iter != val.end()) {
        out << ", ";
      }
    }

    out << "]";

  } else {
    throw "compiler error: no const of type " + type->get_name();
  }

}